

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereLoopAddVirtual(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  int *piVar1;
  byte bVar2;
  SrcList *pSVar3;
  ExprList *pEVar4;
  Parse *pParse;
  Expr *pEVar5;
  undefined4 uVar6;
  ulong mPrereq_00;
  WhereLoop *pWVar7;
  int iVar8;
  sqlite3_index_info *psVar9;
  Select *pSVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  ExprList_item *pEVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  WhereTerm *pWVar19;
  ulong uVar20;
  u16 *puVar21;
  WhereClause *pWVar22;
  u8 uVar23;
  ushort uVar24;
  ulong uVar25;
  long lVar26;
  ushort uVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  int bIn;
  int local_8c;
  ulong local_88;
  sqlite3_index_info *local_80;
  uint local_74;
  ulong local_70;
  undefined8 local_68;
  WhereLoopBuilder *local_60;
  WhereClause *local_58;
  uint local_4c;
  WhereLoop *local_48;
  Parse *local_40;
  ulong local_38;
  
  local_58 = pBuilder->pWC;
  pSVar3 = pBuilder->pWInfo->pTabList;
  local_48 = pBuilder->pNew;
  bVar2 = local_48->iTab;
  local_40 = (Parse *)(pSVar3->a + bVar2);
  pEVar4 = pBuilder->pOrderBy;
  iVar12 = local_58->nTerm;
  iVar8 = 0;
  if (0 < iVar12) {
    puVar21 = &local_58->a->wtFlags;
    iVar8 = 0;
    do {
      if (((*(int *)(puVar21 + 5) == pSVar3->a[bVar2].iCursor) &&
          ((*(ulong *)(puVar21 + 0xf) & mUnusable) == 0)) && ((puVar21[1] & 0xf7ff) != 0)) {
        iVar8 = iVar8 + (uint)((*puVar21 & 0x80) == 0);
      }
      puVar21 = puVar21 + 0x20;
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
  }
  pParse = pBuilder->pWInfo->pParse;
  uVar28 = 0;
  if (pEVar4 != (ExprList *)0x0) {
    uVar11 = pEVar4->nExpr;
    uVar13 = 0;
    if (0 < (int)uVar11) {
      pEVar14 = pEVar4->a;
      uVar13 = 0;
      do {
        if ((pEVar14->pExpr->op != 0xa2) || (pEVar14->pExpr->iTable != pSVar3->a[bVar2].iCursor))
        goto LAB_0018516a;
        uVar13 = uVar13 + 1;
        pEVar14 = pEVar14 + 1;
      } while (uVar11 != uVar13);
      uVar13 = (ulong)uVar11;
    }
LAB_0018516a:
    uVar28 = 0;
    if ((uint)uVar13 == uVar11) {
      uVar28 = uVar11;
    }
  }
  lVar26 = (long)iVar8;
  local_88 = CONCAT44(local_88._4_4_,uVar28);
  local_60 = pBuilder;
  psVar9 = (sqlite3_index_info *)
           sqlite3DbMallocZero(pParse->db,(long)(int)uVar28 * 8 + lVar26 * 0x14 + 0x70);
  pWVar7 = local_48;
  if (psVar9 == (sqlite3_index_info *)0x0) {
    sqlite3ErrorMsg(pParse,"out of memory");
  }
  else {
    psVar9->nConstraint = iVar8;
    psVar9->nOrderBy = uVar28;
    psVar9->aConstraint = (sqlite3_index_constraint *)&psVar9[1].nOrderBy;
    psVar9->aOrderBy = (sqlite3_index_orderby *)(&psVar9[1].nOrderBy + lVar26 * 3);
    psVar9->aConstraintUsage =
         (sqlite3_index_constraint_usage *)
         ((sqlite3_index_orderby *)(&psVar9[1].nOrderBy + lVar26 * 3) + (int)uVar28);
    *(WhereClause **)(psVar9 + 1) = local_58;
    psVar9[1].aConstraint = (sqlite3_index_constraint *)pParse;
    uVar28 = local_58->nTerm;
    if ((int)uVar28 < 1) {
      uVar6 = 0;
    }
    else {
      pWVar19 = local_58->a;
      iVar12 = local_40->iSelfTab;
      uVar11 = 0;
      iVar8 = 0;
      local_70 = local_70 & 0xffffffff00000000;
      do {
        if ((((pWVar19->leftCursor == iVar12) && ((pWVar19->prereqRight & mUnusable) == 0)) &&
            ((uVar24 = pWVar19->eOperator, (uVar24 & 0xf7ff) != 0 &&
             ((pWVar19->wtFlags & 0x80) == 0)))) &&
           ((((((anon_struct_4_7_7ffbf296_for_fg *)&local_40->szOpAlloc)->jointype & 8) == 0 ||
             ((uVar24 & 0x180) == 0)) || ((pWVar19->pExpr->flags & 1) != 0)))) {
          piVar1 = &psVar9[1].nOrderBy + (long)iVar8 * 3;
          *piVar1 = (pWVar19->u).leftColumn;
          piVar1[2] = uVar11;
          uVar24 = uVar24 & 0x1fff;
          uVar27 = uVar24;
          if (uVar24 == 1) {
            uVar27 = 2;
          }
          if (uVar27 == 0x40) {
            uVar23 = pWVar19->eMatchOp;
LAB_001852cf:
            *(u8 *)(piVar1 + 1) = uVar23;
          }
          else {
            if ((uVar27 & 0x180) != 0) {
              uVar23 = 'H' - (uVar27 == 0x100);
              goto LAB_001852cf;
            }
            *(char *)(piVar1 + 1) = (char)uVar27;
            if ((uVar27 & 0x3c) != 0) {
              pEVar5 = pWVar19->pExpr->pRight;
              uVar23 = pEVar5->op;
              if (uVar23 == 0xa8) {
                uVar23 = pEVar5->op2;
              }
              if (uVar23 == 0x83) {
                pSVar10 = (pEVar5->x).pSelect;
              }
              else {
                if (uVar23 != 0xa9) goto LAB_001852d3;
                pSVar10 = (Select *)&pEVar5->x;
              }
              if (1 < ((anon_union_8_2_a01b6dbf_for_x *)&pSVar10->pEList)->pList->nExpr) {
                uVar29 = 1 << ((byte)uVar11 & 0x1f);
                if (0xf < uVar11) {
                  uVar29 = 0;
                }
                local_70 = CONCAT44(local_70._4_4_,(uint)local_70 | uVar29);
                if (uVar24 == 0x10) {
                  uVar23 = '\b';
                }
                else {
                  if (uVar24 != 4) goto LAB_001852d3;
                  uVar23 = ' ';
                }
                goto LAB_001852cf;
              }
            }
          }
LAB_001852d3:
          iVar8 = iVar8 + 1;
        }
        uVar11 = uVar11 + 1;
        pWVar19 = pWVar19 + 1;
      } while (uVar28 != uVar11);
      uVar6 = (uint)local_70;
      local_68 = lVar26 * 3;
    }
    if (0 < (int)local_88) {
      pEVar14 = pEVar4->a;
      uVar13 = 0;
      do {
        (&psVar9[1].nOrderBy)[lVar26 * 3 + uVar13 * 2] = (int)pEVar14->pExpr->iColumn;
        (&psVar9[1].field_0x14)[uVar13 * 8 + lVar26 * 0xc] = pEVar14->sortOrder;
        uVar13 = uVar13 + 1;
        pEVar14 = pEVar14 + 1;
      } while ((local_88 & 0xffffffff) != uVar13);
    }
    local_48->rSetup = 0;
    local_48->wsFlags = 0x400;
    local_48->nLTerm = 0;
    (local_48->u).vtab.needFree = '\0';
    uVar28 = psVar9->nConstraint;
    local_80 = psVar9;
    iVar12 = whereLoopResize(pParse->db,local_48,uVar28);
    if (iVar12 == 0) {
      local_88 = (ulong)uVar28;
      local_40 = pParse;
      iVar12 = whereLoopAddVirtualOne
                         (local_60,mPrereq,0xffffffffffffffff,0,psVar9,(u16)uVar6,&local_8c);
      psVar9 = local_80;
      if (iVar12 == 0) {
        local_68 = CONCAT44(local_68._4_4_,uVar6) & 0xffffffff0000ffff;
        uVar30 = ~mPrereq;
        uVar13 = pWVar7->prereq & uVar30;
        iVar12 = 0;
        local_70 = mPrereq;
        if (local_8c != 0 || uVar13 != 0) {
          if (local_8c == 0) {
            uVar25 = 0;
            local_74 = 0;
          }
          else {
            iVar12 = whereLoopAddVirtualOne
                               (local_60,mPrereq,0xffffffffffffffff,1,local_80,(u16)local_68,
                                &local_8c);
            uVar25 = local_48->prereq & uVar30;
            psVar9 = local_80;
            if (iVar12 != 0) goto LAB_0018565e;
            local_74 = (uint)(uVar25 == 0);
          }
          mPrereq_00 = local_70;
          lVar26 = local_88 * 0xc;
          uVar15 = 0;
          pWVar22 = local_58;
          psVar9 = local_80;
          local_4c = local_74;
          local_38 = uVar25;
          do {
            if ((int)local_88 < 1) {
LAB_001855df:
              iVar12 = 0;
              uVar28 = local_74;
              if ((local_4c == 0) &&
                 (iVar12 = whereLoopAddVirtualOne
                                     (local_60,local_70,local_70,0,psVar9,(u16)local_68,&local_8c),
                 psVar9 = local_80, uVar28 = local_74, local_8c == 0)) {
                uVar28 = 1;
              }
              if (uVar28 == 0 && iVar12 == 0) {
                iVar12 = whereLoopAddVirtualOne
                                   (local_60,local_70,local_70,1,psVar9,(u16)local_68,&local_8c);
                psVar9 = local_80;
              }
              break;
            }
            lVar18 = 0;
            uVar16 = 0xffffffffffffffff;
            do {
              uVar20 = pWVar22->a[*(int *)((long)&psVar9->aConstraint->iTermOffset + lVar18)].
                       prereqRight & uVar30;
              uVar17 = uVar16;
              if (uVar20 < uVar16) {
                uVar17 = uVar20;
              }
              if (uVar20 <= uVar15) {
                uVar17 = uVar16;
              }
              lVar18 = lVar18 + 0xc;
              uVar16 = uVar17;
            } while (lVar26 != lVar18);
            if (uVar17 == 0xffffffffffffffff) goto LAB_001855df;
            iVar12 = 0;
            if (((uVar17 != uVar13) && (uVar17 != uVar25)) &&
               ((iVar12 = whereLoopAddVirtualOne
                                    (local_60,mPrereq_00,uVar17 | mPrereq_00,0,psVar9,(u16)local_68,
                                     &local_8c), pWVar22 = local_58, psVar9 = local_80,
                uVar25 = local_38, local_48->prereq == mPrereq_00 && (local_4c = 1, local_8c == 0)))
               ) {
              local_74 = 1;
            }
            uVar15 = uVar17;
          } while (iVar12 == 0);
        }
      }
LAB_0018565e:
      if (psVar9->needToFreeIdxStr != 0) {
        sqlite3_free(psVar9->idxStr);
        psVar9 = local_80;
      }
      sqlite3DbFreeNN(local_40->db,psVar9);
      return iVar12;
    }
    sqlite3DbFreeNN(pParse->db,psVar9);
  }
  return 7;
}

Assistant:

static int whereLoopAddVirtual(
  WhereLoopBuilder *pBuilder,  /* WHERE clause information */
  Bitmask mPrereq,             /* Tables that must be scanned before this one */
  Bitmask mUnusable            /* Tables that must be scanned after this one */
){
  int rc = SQLITE_OK;          /* Return code */
  WhereInfo *pWInfo;           /* WHERE analysis context */
  Parse *pParse;               /* The parsing context */
  WhereClause *pWC;            /* The WHERE clause */
  struct SrcList_item *pSrc;   /* The FROM clause term to search */
  sqlite3_index_info *p;       /* Object to pass to xBestIndex() */
  int nConstraint;             /* Number of constraints in p */
  int bIn;                     /* True if plan uses IN(...) operator */
  WhereLoop *pNew;
  Bitmask mBest;               /* Tables used by best possible plan */
  u16 mNoOmit;

  assert( (mPrereq & mUnusable)==0 );
  pWInfo = pBuilder->pWInfo;
  pParse = pWInfo->pParse;
  pWC = pBuilder->pWC;
  pNew = pBuilder->pNew;
  pSrc = &pWInfo->pTabList->a[pNew->iTab];
  assert( IsVirtual(pSrc->pTab) );
  p = allocateIndexInfo(pParse, pWC, mUnusable, pSrc, pBuilder->pOrderBy, 
      &mNoOmit);
  if( p==0 ) return SQLITE_NOMEM_BKPT;
  pNew->rSetup = 0;
  pNew->wsFlags = WHERE_VIRTUALTABLE;
  pNew->nLTerm = 0;
  pNew->u.vtab.needFree = 0;
  nConstraint = p->nConstraint;
  if( whereLoopResize(pParse->db, pNew, nConstraint) ){
    sqlite3DbFree(pParse->db, p);
    return SQLITE_NOMEM_BKPT;
  }

  /* First call xBestIndex() with all constraints usable. */
  WHERETRACE(0x800, ("BEGIN %s.addVirtual()\n", pSrc->pTab->zName));
  WHERETRACE(0x40, ("  VirtualOne: all usable\n"));
  rc = whereLoopAddVirtualOne(pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn);

  /* If the call to xBestIndex() with all terms enabled produced a plan
  ** that does not require any source tables (IOW: a plan with mBest==0)
  ** and does not use an IN(...) operator, then there is no point in making 
  ** any further calls to xBestIndex() since they will all return the same
  ** result (if the xBestIndex() implementation is sane). */
  if( rc==SQLITE_OK && ((mBest = (pNew->prereq & ~mPrereq))!=0 || bIn) ){
    int seenZero = 0;             /* True if a plan with no prereqs seen */
    int seenZeroNoIN = 0;         /* Plan with no prereqs and no IN(...) seen */
    Bitmask mPrev = 0;
    Bitmask mBestNoIn = 0;

    /* If the plan produced by the earlier call uses an IN(...) term, call
    ** xBestIndex again, this time with IN(...) terms disabled. */
    if( bIn ){
      WHERETRACE(0x40, ("  VirtualOne: all usable w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, ALLBITS, WO_IN, p, mNoOmit, &bIn);
      assert( bIn==0 );
      mBestNoIn = pNew->prereq & ~mPrereq;
      if( mBestNoIn==0 ){
        seenZero = 1;
        seenZeroNoIN = 1;
      }
    }

    /* Call xBestIndex once for each distinct value of (prereqRight & ~mPrereq) 
    ** in the set of terms that apply to the current virtual table.  */
    while( rc==SQLITE_OK ){
      int i;
      Bitmask mNext = ALLBITS;
      assert( mNext>0 );
      for(i=0; i<nConstraint; i++){
        Bitmask mThis = (
            pWC->a[p->aConstraint[i].iTermOffset].prereqRight & ~mPrereq
        );
        if( mThis>mPrev && mThis<mNext ) mNext = mThis;
      }
      mPrev = mNext;
      if( mNext==ALLBITS ) break;
      if( mNext==mBest || mNext==mBestNoIn ) continue;
      WHERETRACE(0x40, ("  VirtualOne: mPrev=%04llx mNext=%04llx\n",
                       (sqlite3_uint64)mPrev, (sqlite3_uint64)mNext));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mNext|mPrereq, 0, p, mNoOmit, &bIn);
      if( pNew->prereq==mPrereq ){
        seenZero = 1;
        if( bIn==0 ) seenZeroNoIN = 1;
      }
    }

    /* If the calls to xBestIndex() in the above loop did not find a plan
    ** that requires no source tables at all (i.e. one guaranteed to be
    ** usable), make a call here with all source tables disabled */
    if( rc==SQLITE_OK && seenZero==0 ){
      WHERETRACE(0x40, ("  VirtualOne: all disabled\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, 0, p, mNoOmit, &bIn);
      if( bIn==0 ) seenZeroNoIN = 1;
    }

    /* If the calls to xBestIndex() have so far failed to find a plan
    ** that requires no source tables at all and does not use an IN(...)
    ** operator, make a final call to obtain one here.  */
    if( rc==SQLITE_OK && seenZeroNoIN==0 ){
      WHERETRACE(0x40, ("  VirtualOne: all disabled and w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, WO_IN, p, mNoOmit, &bIn);
    }
  }

  if( p->needToFreeIdxStr ) sqlite3_free(p->idxStr);
  sqlite3DbFreeNN(pParse->db, p);
  WHERETRACE(0x800, ("END %s.addVirtual(), rc=%d\n", pSrc->pTab->zName, rc));
  return rc;
}